

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>::~unique_ptr
          (unique_ptr<Catch::Detail::EnumInfo> *this)

{
  EnumInfo *pEVar1;
  pointer ppVar2;
  
  pEVar1 = this->m_ptr;
  if ((pEVar1 != (EnumInfo *)0x0) &&
     (ppVar2 = (pEVar1->m_values).
               super__Vector_base<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
               ._M_impl.super__Vector_impl_data._M_start, ppVar2 != (pointer)0x0)) {
    operator_delete(ppVar2,(long)(pEVar1->m_values).
                                 super__Vector_base<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2);
  }
  operator_delete(pEVar1,0x28);
  return;
}

Assistant:

~unique_ptr() {
            delete m_ptr;
        }